

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O1

void int_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                   JSAMPARRAY output_data)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  JSAMPROW pJVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long local_60;
  long local_58;
  
  iVar3 = compptr->width_in_blocks * 8;
  iVar6 = cinfo->max_h_samp_factor / compptr->h_samp_factor;
  iVar9 = cinfo->max_v_samp_factor;
  uVar2 = (long)iVar9 / (long)compptr->v_samp_factor;
  if (0 < (long)iVar9) {
    uVar1 = cinfo->image_width;
    if (0 < (int)(iVar6 * iVar3 - uVar1)) {
      lVar10 = 0;
      do {
        memset(input_data[lVar10] + uVar1,(uint)input_data[lVar10][(ulong)uVar1 - 1],
               (ulong)(iVar6 * iVar3 + ~uVar1) + 1);
        lVar10 = lVar10 + 1;
      } while (iVar9 != lVar10);
    }
  }
  if (0 < compptr->v_samp_factor) {
    iVar9 = (int)uVar2;
    local_60 = 0;
    local_58 = 0;
    do {
      if (iVar3 != 0) {
        pJVar5 = output_data[local_60];
        uVar11 = 0;
        iVar7 = 0;
        do {
          if (iVar9 < 1) {
            lVar10 = 0;
          }
          else {
            uVar4 = 0;
            lVar10 = 0;
            do {
              if (0 < iVar6) {
                lVar8 = 0;
                do {
                  lVar10 = lVar10 + (ulong)input_data[local_58 + uVar4][lVar8 + uVar11];
                  lVar8 = lVar8 + 1;
                } while (iVar6 != (int)lVar8);
              }
              uVar4 = uVar4 + 1;
            } while (uVar4 != (uVar2 & 0xffffffff));
          }
          *pJVar5 = (JSAMPLE)((lVar10 + (iVar9 * iVar6) / 2) / (long)(iVar9 * iVar6));
          pJVar5 = pJVar5 + 1;
          iVar7 = iVar7 + 1;
          uVar11 = (ulong)(uint)((int)uVar11 + iVar6);
        } while (iVar7 != iVar3);
      }
      local_58 = local_58 + iVar9;
      local_60 = local_60 + 1;
    } while (local_60 < compptr->v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
int_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
               JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow, outrow, h_expand, v_expand, numpix, numpix2, h, v;
  JDIMENSION outcol, outcol_h;  /* outcol_h == outcol*h_expand */
  JDIMENSION output_cols = compptr->width_in_blocks * DCTSIZE;
  JSAMPROW inptr, outptr;
  JLONG outvalue;

  h_expand = cinfo->max_h_samp_factor / compptr->h_samp_factor;
  v_expand = cinfo->max_v_samp_factor / compptr->v_samp_factor;
  numpix = h_expand * v_expand;
  numpix2 = numpix / 2;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor, cinfo->image_width,
                    output_cols * h_expand);

  inrow = 0;
  for (outrow = 0; outrow < compptr->v_samp_factor; outrow++) {
    outptr = output_data[outrow];
    for (outcol = 0, outcol_h = 0; outcol < output_cols;
         outcol++, outcol_h += h_expand) {
      outvalue = 0;
      for (v = 0; v < v_expand; v++) {
        inptr = input_data[inrow + v] + outcol_h;
        for (h = 0; h < h_expand; h++) {
          outvalue += (JLONG)(*inptr++);
        }
      }
      *outptr++ = (JSAMPLE)((outvalue + numpix2) / numpix);
    }
    inrow += v_expand;
  }
}